

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O0

int init_tree(void)

{
  bool bVar1;
  int local_10;
  uint local_c;
  int i;
  
  for (local_10 = 0; local_10 < 0x100; local_10 = local_10 + 1) {
    symbol_node_array[local_10] = (adh_node_t *)0x0;
  }
  adh_next_order = 0x201;
  bVar1 = adh_root_node == (adh_node_t *)0x0;
  if (bVar1) {
    adh_nyt_node = create_nyt();
    adh_root_node = adh_nyt_node;
  }
  else {
    perror("init_tree: root already initialized");
  }
  local_c = (uint)!bVar1;
  return local_c;
}

Assistant:

int init_tree() {
#ifdef _DEBUG
    log_trace("adh_init_tree", "\n");
#endif

    for (int i = 0; i < MAX_CODE_BITS; ++i) {
        symbol_node_array[i] = NULL;
    }

    adh_next_order = MAX_ORDER;
    if(adh_root_node != NULL) {
        perror("init_tree: root already initialized");
        return RC_FAIL;
    }

    adh_nyt_node = adh_root_node = create_nyt();
    return RC_OK;
}